

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::ClientImpl::write_request
          (ClientImpl *this,Stream *strm,Request *req,bool close_connection,Error *error)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  unsigned_long __val;
  char *pcVar4;
  size_t sVar5;
  string *data;
  char *local_2a8;
  string local_2a0;
  string *local_280;
  string *path;
  BufferStream bstrm;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_240;
  _Base_ptr local_200;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f8;
  _Base_ptr local_1b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  _Base_ptr local_170;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  _Base_ptr local_128;
  undefined1 local_120 [8];
  string length_1;
  undefined1 local_e8 [8];
  string length;
  allocator<char> local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> agent;
  Error *error_local;
  bool close_connection_local;
  Request *req_local;
  Stream *strm_local;
  ClientImpl *this_local;
  
  if ((close_connection) && (bVar1 = Request::has_header(req,"Connection"), !bVar1)) {
    std::
    multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::emplace<char_const(&)[11],char_const(&)[6]>
              ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&req->headers,(char (*) [11])"Connection",(char (*) [6])"close");
  }
  bVar1 = Request::has_header(req,"Host");
  if (!bVar1) {
    uVar2 = (*this->_vptr_ClientImpl[6])();
    if ((uVar2 & 1) == 0) {
      if (this->port_ == 0x50) {
        std::
        multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::emplace<char_const(&)[5],std::__cxx11::string_const&>
                  ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&req->headers,(char (*) [5])"Host",&this->host_);
      }
      else {
        std::
        multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::emplace<char_const(&)[5],std::__cxx11::string_const&>
                  ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&req->headers,(char (*) [5])"Host",&this->host_and_port_);
      }
    }
    else if (this->port_ == 0x1bb) {
      std::
      multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::emplace<char_const(&)[5],std::__cxx11::string_const&>
                ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&req->headers,(char (*) [5])"Host",&this->host_);
    }
    else {
      std::
      multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::emplace<char_const(&)[5],std::__cxx11::string_const&>
                ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&req->headers,(char (*) [5])"Host",&this->host_and_port_);
    }
  }
  bVar1 = Request::has_header(req,"Accept");
  if (!bVar1) {
    agent.field_2._8_8_ =
         std::
         multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
         ::emplace<char_const(&)[7],char_const(&)[4]>
                   ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                     *)&req->headers,(char (*) [7])"Accept",(char (*) [4])"*/*");
  }
  bVar1 = Request::has_header(req,"User-Agent");
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"cpp-httplib/",&local_a9)
    ;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                   &local_a8,"0.10.6");
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
    length.field_2._8_8_ =
         std::
         multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
         ::emplace<char_const(&)[11],std::__cxx11::string&>
                   ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                     *)&req->headers,(char (*) [11])"User-Agent",
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
    std::__cxx11::string::~string((string *)local_88);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    bVar1 = Request::has_header(req,"Content-Type");
    if (!bVar1) {
      length_1.field_2._8_8_ =
           std::
           multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           ::emplace<char_const(&)[13],char_const(&)[11]>
                     ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                       *)&req->headers,(char (*) [13])"Content-Type",(char (*) [11])"text/plain");
    }
    bVar1 = Request::has_header(req,"Content-Length");
    if (!bVar1) {
      __val = std::__cxx11::string::size();
      std::__cxx11::to_string((string *)local_120,__val);
      local_128 = (_Base_ptr)
                  std::
                  multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  ::emplace<char_const(&)[15],std::__cxx11::string&>
                            ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                              *)&req->headers,(char (*) [15])"Content-Length",(string *)local_120);
      std::__cxx11::string::~string((string *)local_120);
    }
  }
  else {
    bVar1 = std::function::operator_cast_to_bool((function *)&req->content_provider_);
    if (bVar1) {
      if (((req->is_chunked_content_provider_ & 1U) == 0) &&
         (bVar1 = Request::has_header(req,"Content-Length"), !bVar1)) {
        std::__cxx11::to_string((string *)local_e8,req->content_length_);
        std::
        multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::emplace<char_const(&)[15],std::__cxx11::string&>
                  ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&req->headers,(char (*) [15])"Content-Length",(string *)local_e8);
        std::__cxx11::string::~string((string *)local_e8);
      }
    }
    else {
      bVar1 = std::operator==(&req->method,"POST");
      if (((bVar1) || (bVar1 = std::operator==(&req->method,"PUT"), bVar1)) ||
         (bVar1 = std::operator==(&req->method,"PATCH"), bVar1)) {
        std::
        multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::emplace<char_const(&)[15],char_const(&)[2]>
                  ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&req->headers,(char (*) [15])"Content-Length",(char (*) [2])0x1bffb4);
      }
    }
  }
  uVar3 = std::__cxx11::string::empty();
  if ((((uVar3 & 1) == 0) || (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) &&
     (bVar1 = Request::has_header(req,"Authorization"), !bVar1)) {
    make_basic_authentication_header
              (&local_168,&this->basic_auth_username_,&this->basic_auth_password_,false);
    local_170 = (_Base_ptr)
                std::
                multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&req->headers,&local_168);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_168);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((((uVar3 & 1) == 0) && (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) &&
     (bVar1 = Request::has_header(req,"Proxy-Authorization"), !bVar1)) {
    make_basic_authentication_header
              (&local_1b0,&this->proxy_basic_auth_username_,&this->proxy_basic_auth_password_,true);
    local_1b8 = (_Base_ptr)
                std::
                multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&req->headers,&local_1b0);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_1b0);
  }
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) == 0) && (bVar1 = Request::has_header(req,"Authorization"), !bVar1)) {
    make_bearer_token_authentication_header(&local_1f8,&this->bearer_token_auth_token_,false);
    local_200 = (_Base_ptr)
                std::
                multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&req->headers,&local_1f8);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_1f8);
  }
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) == 0) && (bVar1 = Request::has_header(req,"Proxy-Authorization"), !bVar1)) {
    make_bearer_token_authentication_header(&local_240,&this->proxy_bearer_token_auth_token_,true);
    bstrm.position =
         (size_t)std::
                 multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                 ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                           ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                             *)&req->headers,&local_240);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_240);
  }
  detail::BufferStream::BufferStream((BufferStream *)&path);
  if ((this->url_encode_ & 1U) == 0) {
    std::__cxx11::string::string((string *)&local_2a0,(string *)&req->path);
  }
  else {
    detail::encode_url(&local_2a0,&req->path);
  }
  local_280 = &local_2a0;
  local_2a8 = (char *)std::__cxx11::string::c_str();
  data = (string *)std::__cxx11::string::c_str();
  Stream::write_format<char_const*,char_const*>
            ((Stream *)&path,"%s %s HTTP/1.1\r\n",&local_2a8,(char **)&data);
  detail::write_headers((Stream *)&path,&req->headers);
  detail::BufferStream::get_buffer_abi_cxx11_((BufferStream *)&path);
  pcVar4 = (char *)std::__cxx11::string::data();
  sVar5 = std::__cxx11::string::size();
  bVar1 = detail::write_data(strm,pcVar4,sVar5);
  if (!bVar1) {
    *error = Write;
    this_local._7_1_ = 0;
  }
  std::__cxx11::string::~string((string *)&local_2a0);
  detail::BufferStream::~BufferStream((BufferStream *)&path);
  if (bVar1) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      pcVar4 = (char *)std::__cxx11::string::data();
      sVar5 = std::__cxx11::string::size();
      bVar1 = detail::write_data(strm,pcVar4,sVar5);
      if (bVar1) {
        this_local._7_1_ = 1;
      }
      else {
        *error = Write;
        this_local._7_1_ = 0;
      }
    }
    else {
      this_local._7_1_ = write_content_with_provider(this,strm,req,error);
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

inline bool ClientImpl::write_request(Stream &strm, Request &req,
                                      bool close_connection, Error &error) {
  // Prepare additional headers
  if (close_connection) {
    if (!req.has_header("Connection")) {
      req.headers.emplace("Connection", "close");
    }
  }

  if (!req.has_header("Host")) {
    if (is_ssl()) {
      if (port_ == 443) {
        req.headers.emplace("Host", host_);
      } else {
        req.headers.emplace("Host", host_and_port_);
      }
    } else {
      if (port_ == 80) {
        req.headers.emplace("Host", host_);
      } else {
        req.headers.emplace("Host", host_and_port_);
      }
    }
  }

  if (!req.has_header("Accept")) { req.headers.emplace("Accept", "*/*"); }

#ifndef CPPHTTPLIB_NO_DEFAULT_USER_AGENT
  if (!req.has_header("User-Agent")) {
    auto agent = std::string("cpp-httplib/") + CPPHTTPLIB_VERSION;
    req.headers.emplace("User-Agent", agent);
  }
#endif

  if (req.body.empty()) {
    if (req.content_provider_) {
      if (!req.is_chunked_content_provider_) {
        if (!req.has_header("Content-Length")) {
          auto length = std::to_string(req.content_length_);
          req.headers.emplace("Content-Length", length);
        }
      }
    } else {
      if (req.method == "POST" || req.method == "PUT" ||
          req.method == "PATCH") {
        req.headers.emplace("Content-Length", "0");
      }
    }
  } else {
    if (!req.has_header("Content-Type")) {
      req.headers.emplace("Content-Type", "text/plain");
    }

    if (!req.has_header("Content-Length")) {
      auto length = std::to_string(req.body.size());
      req.headers.emplace("Content-Length", length);
    }
  }

  if (!basic_auth_password_.empty() || !basic_auth_username_.empty()) {
    if (!req.has_header("Authorization")) {
      req.headers.insert(make_basic_authentication_header(
          basic_auth_username_, basic_auth_password_, false));
    }
  }

  if (!proxy_basic_auth_username_.empty() &&
      !proxy_basic_auth_password_.empty()) {
    if (!req.has_header("Proxy-Authorization")) {
      req.headers.insert(make_basic_authentication_header(
          proxy_basic_auth_username_, proxy_basic_auth_password_, true));
    }
  }

  if (!bearer_token_auth_token_.empty()) {
    if (!req.has_header("Authorization")) {
      req.headers.insert(make_bearer_token_authentication_header(
          bearer_token_auth_token_, false));
    }
  }

  if (!proxy_bearer_token_auth_token_.empty()) {
    if (!req.has_header("Proxy-Authorization")) {
      req.headers.insert(make_bearer_token_authentication_header(
          proxy_bearer_token_auth_token_, true));
    }
  }

  // Request line and headers
  {
    detail::BufferStream bstrm;

    const auto &path = url_encode_ ? detail::encode_url(req.path) : req.path;
    bstrm.write_format("%s %s HTTP/1.1\r\n", req.method.c_str(), path.c_str());

    detail::write_headers(bstrm, req.headers);

    // Flush buffer
    auto &data = bstrm.get_buffer();
    if (!detail::write_data(strm, data.data(), data.size())) {
      error = Error::Write;
      return false;
    }
  }

  // Body
  if (req.body.empty()) {
    return write_content_with_provider(strm, req, error);
  }

  if (!detail::write_data(strm, req.body.data(), req.body.size())) {
    error = Error::Write;
    return false;
  }

  return true;
}